

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_routing_linux.c
# Opt level: O1

void os_routing_linux_interrupt(os_route *route)

{
  if (((route->_internal)._node.list.next != (list_entity *)0x0) &&
     ((route->_internal)._node.list.prev != (list_entity *)0x0)) {
    avl_remove(&_rtnetlink_feedback,&(route->_internal)._node);
    if (route->cb_finished != (_func_void_os_route_ptr_int *)0x0) {
      (*route->cb_finished)(route,-1);
      return;
    }
  }
  return;
}

Assistant:

void
os_routing_linux_interrupt(struct os_route *route) {
  if (os_routing_linux_is_in_progress(route)) {
    _routing_finished(route, -1);
  }
}